

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O0

void __thiscall RGBSpectrum_RoundTripsRGB_Test::TestBody(RGBSpectrum_RoundTripsRGB_Test *this)

{
  anon_class_16_2_f9f080e8 func;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  float r;
  float g;
  float b;
  undefined8 uVar5;
  AssertHelper *this_00;
  XYZ XVar6;
  RGB RVar7;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Float eps;
  RGB rgb2;
  XYZ xyz;
  DenselySampledSpectrum rsIllum;
  RGBReflectanceSpectrum rs;
  RGB rgb;
  int i;
  RGBColorSpace *cs;
  RNG rng;
  DenselySampledSpectrum *in_stack_fffffffffffffdb8;
  RNG *in_stack_fffffffffffffdc0;
  RGB *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  RGBColorSpace *in_stack_fffffffffffffde0;
  Message *in_stack_fffffffffffffde8;
  AssertHelper *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  Allocator in_stack_fffffffffffffe08;
  RGBReflectanceSpectrum *in_stack_fffffffffffffe10;
  RGBColorSpace *in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe30;
  Float in_stack_fffffffffffffe34;
  undefined8 in_stack_fffffffffffffe38;
  RNG *val2;
  RGB *this_01;
  char *expr1;
  AssertionResult local_150 [2];
  float local_12c;
  AssertionResult local_128 [2];
  float local_104;
  AssertionResult local_100;
  undefined4 local_ec;
  undefined8 local_e8;
  Float local_e0;
  undefined8 local_d8;
  Float local_d0;
  undefined8 local_c8;
  Float local_c0;
  undefined8 local_a0;
  Float local_98;
  char *local_88;
  undefined8 local_80;
  char local_4c [28];
  RGB local_30;
  int local_24;
  undefined8 local_20;
  RNG local_18;
  
  pbrt::RNG::RNG(&local_18);
  RVar7.b = in_stack_fffffffffffffe34;
  RVar7.r = (Float)(int)in_stack_fffffffffffffe38;
  RVar7.g = (Float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_20 = pbrt::RGBColorSpace::sRGB;
  for (local_24 = 0; local_24 < 100; local_24 = local_24 + 1) {
    val2 = &local_18;
    r = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffdc0);
    g = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffdc0);
    b = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffdc0);
    uVar5 = 0;
    this_01 = &local_30;
    pbrt::RGB::RGB(this_01,r,g,b);
    expr1 = local_4c;
    pbrt::RGBReflectanceSpectrum::RGBReflectanceSpectrum
              ((RGBReflectanceSpectrum *)in_stack_fffffffffffffde0,
               (RGBColorSpace *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd0);
    local_80 = local_20;
    local_88 = expr1;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffdc0);
    func.cs = in_stack_fffffffffffffe18;
    func.rs = in_stack_fffffffffffffe10;
    pbrt::DenselySampledSpectrum::SampleFunction<RGBSpectrum_RoundTripsRGB_Test::TestBody()::__0>
              (func,(int)in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffe08);
    pbrt::SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum>
              ((SpectrumHandle *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    XVar6 = pbrt::SpectrumToXYZ((SpectrumHandle *)CONCAT44(RVar7.b,in_stack_fffffffffffffe30));
    local_c0 = XVar6.Z;
    this_00 = (AssertHelper *)0x0;
    auVar2._8_8_ = uVar5;
    auVar2._0_8_ = XVar6._0_8_;
    local_c8 = vmovlpd_avx(auVar2);
    iVar4 = (int)local_20;
    local_a0 = local_c8;
    local_98 = local_c0;
    RVar7 = pbrt::RGBColorSpace::ToRGB
                      (in_stack_fffffffffffffde0,
                       (XYZ *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_e0 = RVar7.b;
    auVar1._8_8_ = this_00;
    auVar1._0_8_ = RVar7._0_8_;
    local_e8 = vmovlpd_avx(auVar1);
    local_ec = 0x3c23d70a;
    local_d8._0_4_ = (float)local_e8;
    in_stack_fffffffffffffe30 = local_30.r - (float)local_d8;
    local_d8 = local_e8;
    local_d0 = local_e0;
    std::abs(iVar4);
    local_104 = in_stack_fffffffffffffe30;
    testing::internal::CmpHelperLT<float,float>
              (expr1,(char *)this_01,(float *)CONCAT44(r,g),(float *)val2);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe18 =
           (RGBColorSpace *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdc0,(char (*) [5])in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe10 =
           (RGBReflectanceSpectrum *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffe08.memoryResource =
           (memory_resource *)testing::AssertionResult::failure_message((AssertionResult *)0x59d013)
      ;
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdf0,(Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 (char *)in_stack_fffffffffffffde0,(int)in_stack_fffffffffffffddc,
                 (char *)in_stack_fffffffffffffdd0);
      testing::internal::AssertHelper::operator=(this_00,RVar7._0_8_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      testing::Message::~Message((Message *)0x59d06d);
    }
    iVar4 = (int)&local_100;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x59d0c5);
    in_stack_fffffffffffffe04 = local_30.g - local_d8._4_4_;
    std::abs(iVar4);
    local_12c = in_stack_fffffffffffffe04;
    testing::internal::CmpHelperLT<float,float>
              (expr1,(char *)this_01,(float *)CONCAT44(r,g),(float *)val2);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(local_128);
    in_stack_fffffffffffffe00 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe00);
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdf0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdc0,(char (*) [5])in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffde8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffde0 =
           (RGBColorSpace *)testing::AssertionResult::failure_message((AssertionResult *)0x59d1da);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdf0,(Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 (char *)in_stack_fffffffffffffde0,(int)in_stack_fffffffffffffddc,
                 (char *)in_stack_fffffffffffffdd0);
      testing::internal::AssertHelper::operator=(this_00,RVar7._0_8_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      testing::Message::~Message((Message *)0x59d234);
    }
    iVar4 = (int)local_128;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x59d28c);
    in_stack_fffffffffffffddc = local_30.b - local_d0;
    std::abs(iVar4);
    testing::internal::CmpHelperLT<float,float>
              (expr1,(char *)this_01,(float *)CONCAT44(r,g),(float *)val2);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(local_150);
    in_stack_fffffffffffffdd8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffdd8);
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdf0);
      in_stack_fffffffffffffdd0 =
           (RGB *)testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdc0,(char (*) [5])in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdc0 =
           (RNG *)testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffdc0,(RGB *)in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdb8 =
           (DenselySampledSpectrum *)
           testing::AssertionResult::failure_message((AssertionResult *)0x59d3a1);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdf0,(Type)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 (char *)in_stack_fffffffffffffde0,(int)in_stack_fffffffffffffddc,
                 (char *)in_stack_fffffffffffffdd0);
      testing::internal::AssertHelper::operator=(this_00,RVar7._0_8_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdc0);
      testing::Message::~Message((Message *)0x59d3f9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x59d44e);
    pbrt::DenselySampledSpectrum::~DenselySampledSpectrum((DenselySampledSpectrum *)0x59d45b);
  }
  return;
}

Assistant:

TEST(RGBSpectrum, RoundTripsRGB) {
    RNG rng;
    const RGBColorSpace &cs = *RGBColorSpace::sRGB;

    for (int i = 0; i < 100; ++i) {
        RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
        RGBReflectanceSpectrum rs(cs, rgb);

        DenselySampledSpectrum rsIllum = DenselySampledSpectrum::SampleFunction(
            [&](Float lambda) { return rs(lambda) * cs.illuminant(lambda); });
        XYZ xyz = SpectrumToXYZ(&rsIllum);
        RGB rgb2 = cs.ToRGB(xyz);

        // Some error comes from the fact that piecewise linear (at 5nm)
        // CIE curves were used for the optimization while we use piecewise
        // linear at 1nm spacing converted to 1nm constant / densely
        // sampled.
        Float eps = .01;
        EXPECT_LT(std::abs(rgb.r - rgb2.r), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.g - rgb2.g), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.b - rgb2.b), eps) << rgb << " vs " << rgb2;
    }
}